

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

void __thiscall
File::File(File *this,string *inPath,int umask,bool forRead,bool forWrite,bool create,bool truncate)

{
  int __fd;
  FILE *pFVar1;
  int *piVar2;
  char *pcVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  string *psVar8;
  string fileMode;
  char *local_50;
  char *local_48;
  char local_40 [16];
  
  this->_vptr_File = (_func_int **)&PTR__File_00152d60;
  psVar8 = &this->path;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  this->stream = (FILE *)0x0;
  this->isReadable = forRead;
  this->isWritable = forWrite;
  this->locked = false;
  std::__cxx11::string::_M_assign((string *)psVar8);
  this->valid = false;
  if (forRead || forWrite) {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    uVar4 = 0x241;
    if (!forWrite) {
      uVar4 = 0;
    }
    uVar7 = 2;
    if (!forRead) {
      uVar7 = uVar4 + 2;
    }
    if (!forWrite) {
      uVar7 = 0;
    }
    if (!forRead) {
      uVar7 = uVar4;
    }
    bVar6 = !forRead;
    bVar5 = !forWrite;
    uVar4 = uVar7 | 0x40;
    if (!create) {
      uVar4 = uVar7;
    }
    if (bVar6 || bVar5) {
      uVar4 = uVar7;
    }
    uVar7 = uVar4 | 0x200;
    if (!truncate) {
      uVar7 = uVar4;
    }
    if (!create || (bVar6 || bVar5)) {
      uVar7 = uVar4;
    }
    __fd = open((psVar8->_M_dataplus)._M_p,uVar7,(ulong)(~umask & 0x1b6));
    if (__fd == -1) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      bVar5 = false;
      softHSMLog(3,"File",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/File.cpp"
                 ,0x5e,"Could not open the file (%s): %s",pcVar3,(psVar8->_M_dataplus)._M_p);
    }
    else {
      if (!bVar6 && !forWrite) {
        std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x13d548);
      }
      if (!bVar5 && !forRead) {
        std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x13d006);
      }
      if ((!bVar6 && !bVar5) && !create) {
        std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x13dfba);
      }
      if (create && (!bVar6 && !bVar5)) {
        std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x13dfbd);
      }
      pFVar1 = fdopen(__fd,local_50);
      this->stream = (FILE *)pFVar1;
      bVar5 = pFVar1 != (FILE *)0x0;
    }
    this->valid = bVar5;
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  return;
}

Assistant:

File::File(std::string inPath, int umask, bool forRead /* = true */, bool forWrite /* = false */, bool create /* = false */, bool truncate /* = true */)
{
	stream = NULL;

	isReadable = forRead;
	isWritable = forWrite;
	locked = false;

	path = inPath;
	valid = false;

	if (forRead || forWrite)
	{
		std::string fileMode = "";
		int flags, fd;

#ifndef _WIN32
		flags = 0;
		if (forRead && !forWrite) flags |= O_RDONLY;
		if (!forRead && forWrite) flags |= O_WRONLY | O_CREAT | O_TRUNC;
		if (forRead && forWrite) flags |= O_RDWR;
		if (forRead && forWrite && create) flags |= O_CREAT;
		if (forRead && forWrite && create && truncate) flags |= O_TRUNC;
		// Open the file
		fd = open(path.c_str(), flags, (S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP | S_IROTH | S_IWOTH) & ~umask);
		if (fd == -1)
		{
			ERROR_MSG("Could not open the file (%s): %s", strerror(errno), path.c_str());
			valid = false;
			return;
		}

		if (forRead && !forWrite) fileMode = "r";
		if (!forRead && forWrite) fileMode = "w";
		if (forRead && forWrite && !create) fileMode = "r+";
		if (forRead && forWrite && create) fileMode = "w+";
		// Open the stream
		valid = ((stream = fdopen(fd, fileMode.c_str())) != NULL);
#else
		(void)umask;
		flags = _O_BINARY;
		if (forRead && !forWrite) flags |= _O_RDONLY;
		if (!forRead && forWrite) flags |= _O_WRONLY | _O_CREAT | _O_TRUNC;
		if (forRead && forWrite) flags |= _O_RDWR;
		if (forRead && forWrite && create) flags |= _O_CREAT;
		if (forRead && forWrite && create && truncate) flags |= _O_TRUNC;
		// Open the file
		fd = _open(path.c_str(), flags, _S_IREAD | _S_IWRITE);
		if (fd == -1)
		{
			ERROR_MSG("Could not open the file (%s): %s", strerror(errno), path.c_str());
			valid = false;
			return;
		}

		if (forRead && !forWrite) fileMode = "rb";
		if (!forRead && forWrite) fileMode = "wb";
		if (forRead && forWrite && !create) fileMode = "rb+";
		if (forRead && forWrite && create) fileMode = "wb+";
		// Open the stream
		valid = ((stream = _fdopen(fd, fileMode.c_str())) != NULL);
#endif
	}
}